

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall cmLocalGenerator::AddGeneratorTarget(cmLocalGenerator *this,cmGeneratorTarget *gt)

{
  pointer *pppcVar1;
  iterator __position;
  cmGeneratorTarget *local_18;
  
  __position._M_current =
       (this->GeneratorTargets).
       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_18 = gt;
  if (__position._M_current ==
      (this->GeneratorTargets).
      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
    _M_realloc_insert<cmGeneratorTarget*const&>
              ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)
               &this->GeneratorTargets,__position,&local_18);
  }
  else {
    *__position._M_current = gt;
    pppcVar1 = &(this->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  cmGlobalGenerator::IndexGeneratorTarget(this->GlobalGenerator,local_18);
  return;
}

Assistant:

void cmLocalGenerator::AddGeneratorTarget(cmGeneratorTarget* gt)
{
  this->GeneratorTargets.push_back(gt);
  this->GlobalGenerator->IndexGeneratorTarget(gt);
}